

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

void Tim_ManPrintStats(Tim_Man_t *p,int nAnd2Delay)

{
  int *piVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  void *__s;
  void *__s_00;
  ulong uVar9;
  undefined4 in_register_00000034;
  ulong uVar10;
  size_t __size;
  uint uVar11;
  ulong uVar12;
  
  if (p != (Tim_Man_t *)0x0) {
    Abc_Print((int)p,(char *)CONCAT44(in_register_00000034,nAnd2Delay));
    if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (p->vBoxes->nSize == 0)) {
      uVar7 = p->nCis;
      uVar11 = uVar7;
    }
    else {
      uVar7 = Tim_ManBoxOutputFirst(p,0);
      uVar11 = p->nCis;
    }
    uVar8 = Tim_ManPoNum(p);
    if (p->vBoxes == (Vec_Ptr_t *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)(uint)p->vBoxes->nSize;
    }
    printf("PI/CI = %d/%d   PO/CO = %d/%d   Box = %d   ",(ulong)uVar7,(ulong)uVar11,(ulong)uVar8,
           (ulong)(uint)p->nCos,uVar12);
    if (nAnd2Delay != 0) {
      printf("delay(AND2) = %d");
    }
    putchar(10);
    pVVar3 = p->vBoxes;
    if (pVVar3 != (Vec_Ptr_t *)0x0) {
      uVar7 = pVVar3->nSize;
      uVar12 = (ulong)uVar7;
      if (uVar12 != 0) {
        if ((int)uVar7 < 1) {
          __size = 0x40;
          uVar11 = 0;
          uVar9 = 1;
        }
        else {
          uVar9 = 0;
          uVar11 = 0;
          do {
            uVar8 = *(uint *)((long)pVVar3->pArray[uVar9] + 0x10);
            if ((int)uVar8 < (int)uVar11) {
              uVar8 = uVar11;
            }
            uVar11 = uVar8;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
          uVar9 = (ulong)(uVar11 + 1);
          uVar10 = 0x10;
          if (0xe < uVar11) {
            uVar10 = (ulong)(uVar11 + 1);
          }
          __size = uVar10 << 2;
        }
        __s = malloc(__size);
        if (__s != (void *)0x0) {
          memset(__s,0,uVar9 * 4);
        }
        uVar10 = uVar9;
        if (uVar11 < 7) {
          uVar10 = 8;
        }
        __s_00 = malloc(uVar10 << 3);
        memset(__s_00,0,uVar9 * 8);
        if (0 < (int)uVar7) {
          ppvVar4 = pVVar3->pArray;
          uVar10 = 0;
          do {
            pvVar5 = ppvVar4[uVar10];
            iVar2 = *(int *)((long)pvVar5 + 0x10);
            if (((long)iVar2 < 0) || ((int)uVar11 < iVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            piVar1 = (int *)((long)__s + (long)iVar2 * 4);
            *piVar1 = *piVar1 + 1;
            iVar2 = *(int *)((long)pvVar5 + 0x10);
            if (((long)iVar2 < 0) || ((int)uVar11 < iVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            *(void **)((long)__s_00 + (long)iVar2 * 8) = pvVar5;
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar12);
        }
        uVar12 = 0;
        do {
          uVar7 = *(uint *)((long)__s + uVar12 * 4);
          if (uVar7 != 0) {
            if (uVar11 < uVar12) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            lVar6 = *(long *)((long)__s_00 + uVar12 * 8);
            printf("    Box %4d      ",uVar12 & 0xffffffff);
            printf("Num = %4d   ",(ulong)uVar7);
            printf("Ins = %4d   ",(ulong)*(uint *)(lVar6 + 8));
            printf("Outs = %4d",(ulong)*(uint *)(lVar6 + 0xc));
            putchar(10);
          }
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
        free(__s);
        if (__s_00 != (void *)0x0) {
          free(__s_00);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Tim_ManPrintStats( Tim_Man_t * p, int nAnd2Delay )
{
    Tim_Box_t * pBox;
    Vec_Int_t * vCounts;
    Vec_Ptr_t * vBoxes;
    int i, Count, IdMax;
    if ( p == NULL )
        return;
    Abc_Print( 1, "Hierarchy      :  " );
    printf( "PI/CI = %d/%d   PO/CO = %d/%d   Box = %d   ", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), 
        Tim_ManPoNum(p), Tim_ManCoNum(p), 
        Tim_ManBoxNum(p) );
    if ( nAnd2Delay )
        printf( "delay(AND2) = %d", nAnd2Delay );
    printf( "\n" );
    if ( Tim_ManBoxNum(p) == 0 )
        return;
    IdMax = 0;
    Tim_ManForEachBox( p, pBox, i )
        IdMax = Abc_MaxInt( IdMax, pBox->iDelayTable );
    vCounts = Vec_IntStart( IdMax+1 );
    vBoxes  = Vec_PtrStart( IdMax+1 );
    Tim_ManForEachBox( p, pBox, i )
    {
        Vec_IntAddToEntry( vCounts, pBox->iDelayTable, 1 );
        Vec_PtrWriteEntry( vBoxes, pBox->iDelayTable, pBox );
    }
    // print statistics about boxes
    Vec_IntForEachEntry( vCounts, Count, i )
    {
        if ( Count == 0 ) continue;
        pBox = (Tim_Box_t *)Vec_PtrEntry( vBoxes, i );
        printf( "    Box %4d      ", i );
        printf( "Num = %4d   ", Count );
        printf( "Ins = %4d   ", pBox->nInputs );
        printf( "Outs = %4d",   pBox->nOutputs );
        printf( "\n" );
    }
    Vec_IntFree( vCounts );
    Vec_PtrFree( vBoxes );
}